

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow *window,ImGuiViewportP *viewport)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImGuiViewportP *pIVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  bool bVar7;
  undefined4 extraout_EAX;
  int iVar8;
  undefined4 extraout_EAX_00;
  ulong uVar9;
  ulong uVar10;
  int n;
  long lVar11;
  ImRect IVar12;
  ImRect IVar13;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  pIVar6 = GImGui;
  if (((viewport->super_ImGuiViewport).Flags & 0x280) == 0) {
    return false;
  }
  if (window->Viewport != viewport) {
    IVar12 = ImGuiViewportP::GetRect(viewport);
    IVar13 = ImGuiWindow::Rect(window);
    local_38 = IVar12.Max.x;
    fStack_34 = IVar12.Max.y;
    auVar4._4_4_ = -(uint)(IVar13.Max.y <= fStack_34);
    auVar4._0_4_ = -(uint)(IVar13.Max.x <= local_38);
    auVar4._8_4_ = -(uint)(IVar12.Min.x <= IVar13.Min.x);
    auVar4._12_4_ = -(uint)(IVar12.Min.y <= IVar13.Min.y);
    iVar8 = movmskps(extraout_EAX,auVar4);
    if ((iVar8 == 0xf) && (bVar7 = GetWindowAlwaysWantOwnViewport(window), !bVar7)) {
      for (lVar11 = 0;
          (uVar1 = (pIVar6->Windows).Size, lVar11 < (int)uVar1 &&
          (pIVar2 = (pIVar6->Windows).Data[lVar11], pIVar2 != window)); lVar11 = lVar11 + 1) {
        if (((pIVar2->WasActive == true) && (pIVar2->ViewportOwned == true)) &&
           ((pIVar2->Flags & 0x1000000) == 0)) {
          IVar12 = ImGuiViewportP::GetRect(pIVar2->Viewport);
          IVar13 = ImGuiWindow::Rect(window);
          local_48 = IVar12.Max.x;
          fStack_44 = IVar12.Max.y;
          local_38 = IVar12.Min.x;
          fStack_34 = IVar12.Min.y;
          auVar5._4_4_ = -(uint)(local_38 < IVar13.Max.x);
          auVar5._0_4_ = -(uint)(fStack_34 < IVar13.Max.y);
          auVar5._8_4_ = -(uint)(IVar13.Min.y < fStack_44);
          auVar5._12_4_ = -(uint)(IVar13.Min.x < local_48);
          iVar8 = movmskps(extraout_EAX_00,auVar5);
          if (iVar8 == 0xf) {
            return false;
          }
        }
      }
      if (window->ViewportOwned == true) {
        pIVar3 = window->Viewport;
        uVar10 = 0;
        uVar9 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar9 = uVar10;
        }
        for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          pIVar2 = (pIVar6->Windows).Data[uVar10];
          if (pIVar2->Viewport == pIVar3) {
            pIVar2->Viewport = viewport;
            pIVar2->ViewportId = (viewport->super_ImGuiViewport).ID;
            pIVar2->ViewportOwned = viewport->Window == pIVar2;
          }
        }
      }
      window->Viewport = viewport;
      window->ViewportId = (viewport->super_ImGuiViewport).ID;
      window->ViewportOwned = viewport->Window == window;
      BringWindowToDisplayFront(window);
      return true;
    }
  }
  return false;
}

Assistant:

static bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow* window, ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    if (!(viewport->Flags & (ImGuiViewportFlags_CanHostOtherWindows | ImGuiViewportFlags_Minimized)) || window->Viewport == viewport)
        return false;
    if (!viewport->GetRect().Contains(window->Rect()))
        return false;
    if (GetWindowAlwaysWantOwnViewport(window))
        return false;

    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window_behind = g.Windows[n];
        if (window_behind == window)
            break;
        if (window_behind->WasActive && window_behind->ViewportOwned && !(window_behind->Flags & ImGuiWindowFlags_ChildWindow))
            if (window_behind->Viewport->GetRect().Overlaps(window->Rect()))
                return false;
    }

    // Move to the existing viewport, Move child/hosted windows as well (FIXME-OPT: iterate child)
    ImGuiViewportP* old_viewport = window->Viewport;
    if (window->ViewportOwned)
        for (int n = 0; n < g.Windows.Size; n++)
            if (g.Windows[n]->Viewport == old_viewport)
                SetWindowViewport(g.Windows[n], viewport);
    SetWindowViewport(window, viewport);
    BringWindowToDisplayFront(window);

    return true;
}